

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

void pnga_nbget_ghost_dir(Integer g_a,Integer *mask,Integer *nbhandle)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  C_Integer *pCVar6;
  global_array_t *pgVar7;
  Integer proc;
  Integer IVar8;
  int iVar9;
  C_Integer CVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int _ndim;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer hi_rem [7];
  Integer lo_rem [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer ld [7];
  Integer subscript [7];
  int local_248 [8];
  long local_228 [8];
  long local_1e8 [8];
  Integer local_1a8 [8];
  Integer local_168 [8];
  Integer local_128 [8];
  Integer local_e8 [8];
  long local_a8 [8];
  C_Integer aCStack_68 [7];
  
  lVar1 = g_a + 1000;
  proc = pnga_nodeid();
  sVar2 = GA[lVar1].ndim;
  lVar16 = (long)sVar2;
  if (0 < lVar16) {
    lVar15 = 0;
    do {
      lVar12 = mask[lVar15];
      lVar13 = -lVar12;
      if (0 < lVar12) {
        lVar13 = lVar12;
      }
      if ((lVar12 != 0) && (lVar13 != 1)) {
        pnga_error("nga_nbget_ghost_dir: invalid mask entry",lVar12);
      }
      lVar15 = lVar15 + 1;
    } while (lVar16 != lVar15);
  }
  pnga_distribution(g_a,proc,local_e8,local_128);
  pgVar7 = GA;
  if (0 < sVar2) {
    lVar15 = 0;
    do {
      lVar12 = GA[lVar1].dims[lVar15];
      lVar13 = GA[lVar1].width[lVar15];
      if (mask[lVar15] == -1) {
        lVar5 = local_e8[lVar15];
        if (lVar5 == 1) {
          local_168[lVar15] = (lVar12 - lVar13) + 1;
          local_1a8[lVar15] = lVar12;
        }
        else {
          local_168[lVar15] = lVar5 - lVar13;
          local_1a8[lVar15] = lVar5 + -1;
        }
      }
      else {
        if (mask[lVar15] == 1) {
          lVar5 = local_128[lVar15];
          if (lVar5 == lVar12) {
            local_168[lVar15] = 1;
          }
          else {
            local_168[lVar15] = lVar5 + 1;
            lVar13 = lVar13 + lVar5;
          }
        }
        else {
          local_168[lVar15] = local_e8[lVar15];
          lVar13 = local_128[lVar15];
        }
        local_1a8[lVar15] = lVar13;
      }
      lVar15 = lVar15 + 1;
    } while (lVar16 != lVar15);
  }
  if (0 < sVar2) {
    lVar15 = 0;
    do {
      if (mask[lVar15] == -1) {
        CVar10 = 0;
      }
      else if (mask[lVar15] == 1) {
        CVar10 = (local_128[lVar15] - local_e8[lVar15]) + GA[g_a + 1000].width[lVar15] + 1;
      }
      else {
        CVar10 = GA[g_a + 1000].width[lVar15];
      }
      aCStack_68[lVar15] = CVar10;
      local_a8[lVar15] =
           (local_128[lVar15] - local_e8[lVar15]) + GA[g_a + 1000].width[lVar15] * 2 + 1;
      lVar15 = lVar15 + 1;
    } while (lVar16 != lVar15);
  }
  uVar3 = GA[lVar1].ndim;
  uVar14 = (ulong)(short)uVar3;
  iVar9 = GA[lVar1].distr_type;
  if (iVar9 - 1U < 3) {
    uVar11 = (long)(int)proc % GA[lVar1].num_blocks[0];
    local_248[0] = (int)uVar11;
    if (1 < (short)uVar3) {
      uVar11 = uVar11 & 0xffffffff;
      lVar16 = 0;
      IVar8 = proc;
      do {
        IVar8 = (long)((int)IVar8 - (int)uVar11) / GA[g_a + 1000].num_blocks[lVar16];
        uVar11 = (long)(int)IVar8 % GA[g_a + 1000].num_blocks[lVar16 + 1];
        local_248[lVar16 + 1] = (int)uVar11;
        lVar16 = lVar16 + 1;
      } while ((uVar14 & 0xffffffff) - 1 != lVar16);
    }
    if (0 < (short)uVar3) {
      lVar16 = 0;
      do {
        iVar9 = *(int *)((long)local_248 + lVar16);
        lVar15 = *(long *)((long)GA[g_a + 1000].block_dims + lVar16 * 2);
        *(long *)((long)local_1e8 + lVar16 * 2) = lVar15 * iVar9 + 1;
        lVar15 = ((long)iVar9 + 1) * lVar15;
        *(long *)((long)local_228 + lVar16 * 2) = lVar15;
        lVar12 = *(long *)((long)GA[g_a + 1000].dims + lVar16 * 2);
        if (lVar12 <= lVar15) {
          lVar15 = lVar12;
        }
        *(long *)((long)local_228 + lVar16 * 2) = lVar15;
        lVar16 = lVar16 + 4;
      } while ((uVar14 & 0xffffffff) << 2 != lVar16);
    }
    goto LAB_00190c63;
  }
  if (iVar9 == 4) {
    uVar11 = (long)(int)proc % GA[lVar1].num_blocks[0];
    local_248[0] = (int)uVar11;
    if (1 < (short)uVar3) {
      uVar11 = uVar11 & 0xffffffff;
      lVar16 = 0;
      IVar8 = proc;
      do {
        IVar8 = (long)((int)IVar8 - (int)uVar11) / GA[g_a + 1000].num_blocks[lVar16];
        uVar11 = (long)(int)IVar8 % GA[g_a + 1000].num_blocks[lVar16 + 1];
        local_248[lVar16 + 1] = (int)uVar11;
        lVar16 = lVar16 + 1;
      } while ((uVar14 & 0xffffffff) - 1 != lVar16);
    }
    if (0 < (short)uVar3) {
      pCVar6 = GA[lVar1].mapc;
      lVar16 = 0;
      iVar9 = 0;
      do {
        iVar4 = *(int *)((long)local_248 + lVar16);
        lVar15 = (long)iVar9 + (long)iVar4;
        *(C_Integer *)((long)local_1e8 + lVar16 * 2) = pCVar6[lVar15];
        if ((long)iVar4 < *(long *)((long)GA[lVar1].num_blocks + lVar16 * 2) + -1) {
          lVar15 = GA[lVar1].mapc[lVar15 + 1] + -1;
        }
        else {
          lVar15 = *(long *)((long)GA[lVar1].dims + lVar16 * 2);
        }
        *(long *)((long)local_228 + lVar16 * 2) = lVar15;
        iVar9 = iVar9 + *(int *)((long)GA[lVar1].num_blocks + lVar16 * 2);
        lVar16 = lVar16 + 4;
      } while ((uVar14 & 0xffffffff) << 2 != lVar16);
    }
    goto LAB_00190c63;
  }
  if (iVar9 != 0) goto LAB_00190c63;
  if (GA[lVar1].num_rstrctd == 0) {
    if ((short)uVar3 < 1) {
      lVar16 = 1;
    }
    else {
      lVar16 = 1;
      uVar11 = 0;
      do {
        lVar16 = lVar16 * GA[g_a + 1000].nblock[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
    }
    if ((-1 < proc) && (proc < lVar16)) {
      if (0 < (short)uVar3) {
        pCVar6 = GA[lVar1].mapc;
        uVar11 = 0;
        lVar16 = 0;
        IVar8 = proc;
        do {
          lVar12 = (long)GA[g_a + 1000].nblock[uVar11];
          lVar15 = IVar8 % lVar12;
          local_1e8[uVar11] = pCVar6[lVar15 + lVar16];
          if (lVar15 == lVar12 + -1) {
            CVar10 = GA[g_a + 1000].dims[uVar11];
          }
          else {
            CVar10 = pCVar6[lVar15 + lVar16 + 1] + -1;
          }
          lVar16 = lVar16 + lVar12;
          local_228[uVar11] = CVar10;
          uVar11 = uVar11 + 1;
          IVar8 = IVar8 / lVar12;
        } while (uVar14 != uVar11);
      }
      goto LAB_00190c63;
    }
LAB_00190c2e:
    if ((short)uVar3 < 1) goto LAB_00190c63;
    memset(local_1e8,0,uVar14 << 3);
  }
  else {
    if (proc < GA[lVar1].num_rstrctd) {
      if ((short)uVar3 < 1) {
        lVar16 = 1;
      }
      else {
        lVar16 = 1;
        uVar11 = 0;
        do {
          lVar16 = lVar16 * GA[g_a + 1000].nblock[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      if ((-1 < proc) && (proc < lVar16)) {
        if (0 < (short)uVar3) {
          pCVar6 = GA[lVar1].mapc;
          lVar16 = 0;
          uVar11 = 0;
          IVar8 = proc;
          do {
            lVar12 = (long)GA[g_a + 1000].nblock[uVar11];
            lVar15 = IVar8 % lVar12;
            local_1e8[uVar11] = pCVar6[lVar15 + lVar16];
            if (lVar15 == lVar12 + -1) {
              CVar10 = GA[g_a + 1000].dims[uVar11];
            }
            else {
              CVar10 = pCVar6[lVar15 + lVar16 + 1] + -1;
            }
            lVar16 = lVar16 + lVar12;
            local_228[uVar11] = CVar10;
            uVar11 = uVar11 + 1;
            IVar8 = IVar8 / lVar12;
          } while (uVar14 != uVar11);
        }
        goto LAB_00190c63;
      }
      goto LAB_00190c2e;
    }
    if ((short)uVar3 < 1) goto LAB_00190c63;
    memset(local_1e8,0,(ulong)uVar3 << 3);
  }
  memset(local_228,0xff,uVar14 << 3);
LAB_00190c63:
  if (uVar14 == 1) {
    local_a8[0] = (local_228[0] - local_1e8[0]) + pgVar7[lVar1].width[0] * 2 + 1;
  }
  if ((short)uVar3 < 2) {
    lVar16 = 1;
    lVar15 = 0;
  }
  else {
    lVar16 = 1;
    lVar12 = 0;
    lVar15 = 0;
    do {
      lVar15 = lVar15 + aCStack_68[lVar12] * lVar16;
      lVar13 = (local_228[lVar12] - local_1e8[lVar12]) + pgVar7[g_a + 1000].width[lVar12] * 2 + 1;
      local_a8[lVar12] = lVar13;
      lVar16 = lVar16 * lVar13;
      lVar12 = lVar12 + 1;
    } while (uVar14 - 1 != lVar12);
  }
  pnga_nbget(g_a,local_168,local_1a8,
             pgVar7[lVar1].ptr[proc] +
             (long)pgVar7[lVar1].elemsize * (lVar16 * aCStack_68[uVar14 - 1] + lVar15),local_a8,
             nbhandle);
  return;
}

Assistant:

void pnga_nbget_ghost_dir(Integer g_a,
                               Integer *mask,
                               Integer *nbhandle)
{
  Integer handle = GA_OFFSET + g_a;
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM], lo_rem[MAXDIM], hi_rem[MAXDIM];
  Integer subscript[MAXDIM], ld[MAXDIM];
  Integer i, ndim, dim, width;
  char *ptr_loc;
  Integer me = pnga_nodeid();
  /*Integer p_handle;*/
  ndim = GA[handle].ndim;
  /*p_handle = GA[handle].p_handle;*/
  /* check mask to see that it corresponds to a valid direction */
  for (i=0; i<ndim; i++) {
    if (labs(mask[i]) != 0 && labs(mask[i]) != 1)
      pnga_error("nga_nbget_ghost_dir: invalid mask entry", mask[i]);
  }

  /* get range of data on local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* locate data on remote processor */
  for (i=0; i<ndim; i++) {
    dim = (Integer)GA[handle].dims[i];
    width = (Integer)GA[handle].width[i];
    if (mask[i] == 1) {
      if (hi_loc[i] == dim) {
        lo_rem[i] = 1;
        hi_rem[i] = width;
      } else {
        lo_rem[i] = hi_loc[i]+1;
        hi_rem[i] = hi_loc[i]+width;
      }
    } else if (mask[i] == -1) {
      if (lo_loc[i] == 1) {
        lo_rem[i] = dim - width + 1;
        hi_rem[i] = dim;
      } else {
        lo_rem[i] = lo_loc[i] - width;
        hi_rem[i] = lo_loc[i] - 1;
      }
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }
  
  /* Get pointer to data destination on local block. Start by
     by finding subscript to origin of destination block */
  for (i=0; i<ndim; i++) {
    if (mask[i] == 1) {
      subscript[i] = hi_loc[i]-lo_loc[i]+1+GA[handle].width[i];
    } else if (mask[i] == -1) {
      subscript[i] = 0;
    } else {
      subscript[i] = GA[handle].width[i];
    }
    ld[i] = hi_loc[i]-lo_loc[i]+1+2*GA[handle].width[i];
  }
  gam_LocationWithGhosts(me, handle, subscript, &ptr_loc, ld);
  /* get data */
  pnga_nbget(g_a,lo_rem,hi_rem,ptr_loc,ld,nbhandle);  
}